

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void anon_unknown.dwarf_20a43d::ReplaceValue
               (VmModule *module,VmValue *value,VmValue *original,VmValue *replacement)

{
  SynBase **ppSVar1;
  uint *this;
  uint uVar2;
  VmBlock *pVVar3;
  VariableData *pVVar4;
  VmValue **ppVVar5;
  VmValue *pVVar6;
  VmConstant *second;
  VmConstant *pVVar7;
  VmConstant *first;
  VmConstant *pVVar8;
  VmInstructionType VVar9;
  uint i;
  VmValueType index;
  VmBlock *block;
  InplaceStr *pIVar10;
  VmValue *pVVar11;
  
  if (original == (VmValue *)0x0) {
    __assert_fail("original",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x3f4,
                  "void (anonymous namespace)::ReplaceValue(VmModule *, VmValue *, VmValue *, VmValue *)"
                 );
  }
  if (replacement == (VmValue *)0x0) {
    __assert_fail("replacement",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x3f5,
                  "void (anonymous namespace)::ReplaceValue(VmModule *, VmValue *, VmValue *, VmValue *)"
                 );
  }
  if (value == (VmValue *)0x0) {
LAB_00254c59:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x488,
                  "void (anonymous namespace)::ReplaceValue(VmModule *, VmValue *, VmValue *, VmValue *)"
                 );
  }
  uVar2 = value->typeID;
  if (uVar2 != 2) {
    if (uVar2 == 3) {
      ppVVar5 = (VmValue **)&value[1].comment.end;
      while( true ) {
        pVVar11 = *ppVVar5;
        if (pVVar11 == (VmValue *)0x0) {
          return;
        }
        if (pVVar11 == original) break;
        ReplaceValue(module,pVVar11,original,replacement);
        ppVVar5 = pVVar11[1].users.little;
      }
      __assert_fail("curr != original",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x418,
                    "void (anonymous namespace)::ReplaceValue(VmModule *, VmValue *, VmValue *, VmValue *)"
                   );
    }
    if (uVar2 == 4) {
      if ((VmValue *)value[1].source == original) {
        VmValue::AddUse(replacement,value);
        VmValue::RemoveUse(original,value);
      }
      ppSVar1 = &value[1].source;
      pIVar10 = (InplaceStr *)ppSVar1;
      while (pVVar11 = (VmValue *)pIVar10->begin, pVVar11 != (VmValue *)0x0) {
        if ((pVVar11 == original) && ((VmValue *)*ppSVar1 != original)) {
          __assert_fail("curr != original || curr == function->firstBlock",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x401,
                        "void (anonymous namespace)::ReplaceValue(VmModule *, VmValue *, VmValue *, VmValue *)"
                       );
        }
        ReplaceValue(module,pVVar11,original,replacement);
        pIVar10 = &pVVar11[1].comment;
      }
      block = (VmBlock *)0x0;
      if (replacement->typeID == 3) {
        block = (VmBlock *)replacement;
      }
      if (block == (VmBlock *)*ppSVar1) {
        return;
      }
      VmFunction::DetachBlock((VmFunction *)value,block);
      block->parent = (VmFunction *)value;
      pVVar3 = (VmBlock *)value[1].source;
      block->nextSibling = pVVar3;
      pVVar3->prevSibling = block;
      value[1].source = (SynBase *)block;
      return;
    }
    goto LAB_00254c59;
  }
  if ((*(int *)&value[1]._vptr_VmValue == 0x4d) && (replacement->typeID == 1)) {
    return;
  }
  this = &value[1].typeID;
  for (index = VM_TYPE_VOID; index < value[1].type.type; index = index + VM_TYPE_INT) {
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,index);
    if (*ppVVar5 == original) {
      VmValue::AddUse(replacement,value);
      ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,index);
      *ppVVar5 = replacement;
      VmValue::RemoveUse(original,value);
    }
  }
  switch(*(undefined4 *)&value[1]._vptr_VmValue) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,0);
    pVVar11 = *ppVVar5;
    if (pVVar11 == (VmValue *)0x0) {
      return;
    }
    if (pVVar11->typeID != 1) {
      return;
    }
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,1);
    pVVar6 = *ppVVar5;
    if ((pVVar6 == (VmValue *)0x0) || (pVVar6->typeID != 1)) {
      pVVar6 = (VmValue *)0x0;
    }
    pVVar4 = (VariableData *)pVVar11[1].comment.end;
    if (pVVar4 == (VariableData *)0x0) {
      return;
    }
    if (*(int *)&pVVar6[1]._vptr_VmValue == 0) {
      return;
    }
    pVVar7 = (VmConstant *)0x0;
    first = CreateConstantPointer
                      (module->allocator,(SynBase *)0x0,
                       *(int *)&pVVar6[1]._vptr_VmValue + *(int *)&pVVar11[1]._vptr_VmValue,pVVar4,
                       (pVVar11->type).structType,true);
    VVar9 = *(VmInstructionType *)&value[1]._vptr_VmValue;
    second = CreateConstantInt(module->allocator,(SynBase *)0x0,0);
    if (value[1].type.type == VM_TYPE_LONG) {
      ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,2);
      pVVar7 = (VmConstant *)*ppVVar5;
    }
    pVVar8 = (VmConstant *)0x0;
    break;
  default:
    goto switchD_00254893_caseD_7;
  case 0x1b:
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,0);
    pVVar11 = *ppVVar5;
    if ((pVVar11 != (VmValue *)0x0) && (pVVar11->typeID == 1)) {
      ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,1);
      pVVar6 = *ppVVar5;
      if ((pVVar6 == (VmValue *)0x0) || (pVVar6->typeID != 1)) {
        pVVar6 = (VmValue *)0x0;
      }
      pVVar4 = (VariableData *)pVVar11[1].comment.end;
      if ((pVVar4 != (VariableData *)0x0) && (*(int *)&pVVar6[1]._vptr_VmValue != 0)) {
        pVVar8 = CreateConstantPointer
                           (module->allocator,(SynBase *)0x0,
                            *(int *)&pVVar6[1]._vptr_VmValue + *(int *)&pVVar11[1]._vptr_VmValue,
                            pVVar4,(pVVar11->type).structType,true);
        VVar9 = *(VmInstructionType *)&value[1]._vptr_VmValue;
        pVVar7 = CreateConstantInt(module->allocator,(SynBase *)0x0,0);
        ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,2);
        pVVar11 = *ppVVar5;
        ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,3);
        pVVar6 = *ppVVar5;
        ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,4);
        ChangeInstructionTo(module,(VmInstruction *)value,VVar9,&pVVar8->super_VmValue,
                            &pVVar7->super_VmValue,pVVar11,pVVar6,*ppVVar5,(uint *)0x0);
      }
    }
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,2);
    pVVar11 = *ppVVar5;
    if (pVVar11 == (VmValue *)0x0) {
      return;
    }
    if (pVVar11->typeID != 1) {
      return;
    }
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,3);
    pVVar6 = *ppVVar5;
    if ((pVVar6 == (VmValue *)0x0) || (pVVar6->typeID != 1)) {
      pVVar6 = (VmValue *)0x0;
    }
    pVVar4 = (VariableData *)pVVar11[1].comment.end;
    if (pVVar4 == (VariableData *)0x0) {
      return;
    }
    if (*(int *)&pVVar6[1]._vptr_VmValue == 0) {
      return;
    }
    pVVar7 = CreateConstantPointer
                       (module->allocator,(SynBase *)0x0,
                        *(int *)&pVVar6[1]._vptr_VmValue + *(int *)&pVVar11[1]._vptr_VmValue,pVVar4,
                        (pVVar11->type).structType,true);
    VVar9 = *(VmInstructionType *)&value[1]._vptr_VmValue;
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,0);
    first = (VmConstant *)*ppVVar5;
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,1);
    second = (VmConstant *)*ppVVar5;
    pVVar8 = CreateConstantInt(module->allocator,(SynBase *)0x0,0);
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,4);
    pVVar11 = *ppVVar5;
    goto LAB_00254a2e;
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,1);
    pVVar11 = *ppVVar5;
    if (pVVar11 == (VmValue *)0x0) {
      return;
    }
    if (pVVar11->typeID != 1) {
      return;
    }
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,2);
    pVVar6 = *ppVVar5;
    if ((pVVar6 == (VmValue *)0x0) || (pVVar6->typeID != 1)) {
      pVVar6 = (VmValue *)0x0;
    }
    pVVar4 = (VariableData *)pVVar11[1].comment.end;
    if (pVVar4 == (VariableData *)0x0) {
      return;
    }
    if (*(int *)&pVVar6[1]._vptr_VmValue == 0) {
      return;
    }
    second = CreateConstantPointer
                       (module->allocator,(SynBase *)0x0,
                        *(int *)&pVVar6[1]._vptr_VmValue + *(int *)&pVVar11[1]._vptr_VmValue,pVVar4,
                        (pVVar11->type).structType,true);
    VVar9 = *(VmInstructionType *)&value[1]._vptr_VmValue;
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,0);
    first = (VmConstant *)*ppVVar5;
    pVVar7 = CreateConstantInt(module->allocator,(SynBase *)0x0,0);
    ppVVar5 = SmallArray<VmValue_*,_4U>::operator[]((SmallArray<VmValue_*,_4U> *)this,3);
    pVVar8 = (VmConstant *)*ppVVar5;
  }
  pVVar11 = (VmValue *)0x0;
LAB_00254a2e:
  ChangeInstructionTo(module,(VmInstruction *)value,VVar9,&first->super_VmValue,
                      &second->super_VmValue,&pVVar7->super_VmValue,&pVVar8->super_VmValue,pVVar11,
                      (uint *)0x0);
switchD_00254893_caseD_7:
  return;
}

Assistant:

void ReplaceValue(VmModule *module, VmValue *value, VmValue *original, VmValue *replacement)
	{
		assert(original);
		assert(replacement);

		if(VmFunction *function = getType<VmFunction>(value))
		{
			if(original == function->firstBlock)
			{
				replacement->AddUse(function);
				original->RemoveUse(function);
			}

			for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
			{
				assert(curr != original || curr == function->firstBlock); // Function can only use first block

				ReplaceValue(module, curr, original, replacement);
			}

			// Move replacement block to first position
			VmBlock *block = getType<VmBlock>(replacement);

			if(block != function->firstBlock)
			{
				function->DetachBlock(block);

				block->parent = function;
				block->nextSibling = function->firstBlock;

				function->firstBlock->prevSibling = block;
				function->firstBlock = block;
			}
		}
		else if(VmBlock *block = getType<VmBlock>(value))
		{
			for(VmInstruction *curr = block->firstInstruction; curr; curr = curr->nextSibling)
			{
				assert(curr != original); // Block doesn't use instructions

				ReplaceValue(module, curr, original, replacement);
			}
		}
		else if(VmInstruction *inst = getType<VmInstruction>(value))
		{
			// Can't replace phi instruction argument with a constant
			if(inst->cmd == VM_INST_PHI && isType<VmConstant>(replacement))
				return;

			for(unsigned i = 0; i < inst->arguments.size(); i++)
			{
				if(inst->arguments[i] == original)
				{
					replacement->AddUse(inst);

					inst->arguments[i] = replacement;

					original->RemoveUse(inst);
				}
			}

			// Legalize constant offset in load/store instruction
			switch(inst->cmd)
			{
			case VM_INST_LOAD_BYTE:
			case VM_INST_LOAD_SHORT:
			case VM_INST_LOAD_INT:
			case VM_INST_LOAD_FLOAT:
			case VM_INST_LOAD_DOUBLE:
			case VM_INST_LOAD_LONG:
			case VM_INST_LOAD_STRUCT:
			case VM_INST_STORE_BYTE:
			case VM_INST_STORE_SHORT:
			case VM_INST_STORE_INT:
			case VM_INST_STORE_FLOAT:
			case VM_INST_STORE_DOUBLE:
			case VM_INST_STORE_LONG:
			case VM_INST_STORE_STRUCT:
				if(VmConstant *address = getType<VmConstant>(inst->arguments[0]))
				{
					VmConstant *offset = getType<VmConstant>(inst->arguments[1]);

					if(address->container && offset->iValue != 0)
					{
						VmConstant *target = CreateConstantPointer(module->allocator, NULL, address->iValue + offset->iValue, address->container, address->type.structType, true);

						ChangeInstructionTo(module, inst, inst->cmd, target, CreateConstantInt(module->allocator, NULL, 0), inst->arguments.size() == 3 ? inst->arguments[2] : NULL, NULL, NULL, NULL);
					}
				}
				break;
			case VM_INST_MEM_COPY:
				if(VmConstant *address = getType<VmConstant>(inst->arguments[0]))
				{
					VmConstant *offset = getType<VmConstant>(inst->arguments[1]);

					if(address->container && offset->iValue != 0)
					{
						VmConstant *target = CreateConstantPointer(module->allocator, NULL, address->iValue + offset->iValue, address->container, address->type.structType, true);

						ChangeInstructionTo(module, inst, inst->cmd, target, CreateConstantInt(module->allocator, NULL, 0), inst->arguments[2], inst->arguments[3], inst->arguments[4], NULL);
					}
				}

				if(VmConstant *address = getType<VmConstant>(inst->arguments[2]))
				{
					VmConstant *offset = getType<VmConstant>(inst->arguments[3]);

					if(address->container && offset->iValue != 0)
					{
						VmConstant *target = CreateConstantPointer(module->allocator, NULL, address->iValue + offset->iValue, address->container, address->type.structType, true);

						ChangeInstructionTo(module, inst, inst->cmd, inst->arguments[0], inst->arguments[1], target, CreateConstantInt(module->allocator, NULL, 0), inst->arguments[4], NULL);
					}
				}
				break;
			case VM_INST_ADD_LOAD:
			case VM_INST_SUB_LOAD:
			case VM_INST_MUL_LOAD:
			case VM_INST_DIV_LOAD:
			case VM_INST_POW_LOAD:
			case VM_INST_MOD_LOAD:
			case VM_INST_LESS_LOAD:
			case VM_INST_GREATER_LOAD:
			case VM_INST_LESS_EQUAL_LOAD:
			case VM_INST_GREATER_EQUAL_LOAD:
			case VM_INST_EQUAL_LOAD:
			case VM_INST_NOT_EQUAL_LOAD:
			case VM_INST_SHL_LOAD:
			case VM_INST_SHR_LOAD:
			case VM_INST_BIT_AND_LOAD:
			case VM_INST_BIT_OR_LOAD:
			case VM_INST_BIT_XOR_LOAD:
				if(VmConstant *address = getType<VmConstant>(inst->arguments[1]))
				{
					VmConstant *offset = getType<VmConstant>(inst->arguments[2]);

					if(address->container && offset->iValue != 0)
					{
						VmConstant *target = CreateConstantPointer(module->allocator, NULL, address->iValue + offset->iValue, address->container, address->type.structType, true);

						ChangeInstructionTo(module, inst, inst->cmd, inst->arguments[0], target, CreateConstantInt(module->allocator, NULL, 0), inst->arguments[3], NULL, NULL);
					}
				}
				break;
			default:
				break;
			}
		}
		else
		{
			assert(!"unknown type");
		}
	}